

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_render_pass2
          (Impl *this,Hash hash,VkRenderPassCreateInfo2 *create_info,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  pointer __dest;
  bool bVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Ch *__src;
  Value value;
  Value serialized_render_passes;
  Data local_128;
  Data local_118;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_108;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  Data local_b8;
  void *local_a8;
  void *local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  Data local_78;
  undefined8 local_68;
  void *pvStack_60;
  void *local_58;
  long lStack_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_d8 = 0;
  local_d0 = 0x400;
  local_c8 = 0;
  local_c0 = 0;
  alloc = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  alloc->chunkHead_ = (ChunkHeader *)0x0;
  alloc->chunk_capacity_ = 0x10000;
  alloc->userBuffer_ = (void *)0x0;
  alloc->baseAllocator_ = (CrtAllocator *)0x0;
  alloc->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_118.n = (Number)0x0;
  local_118.s.str = (Ch *)0x3000000000000;
  local_128.n = (Number)0x0;
  local_128.s.str = (Ch *)0x0;
  local_108 = alloc;
  local_100 = alloc;
  bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (create_info,alloc,(Value *)&local_128.s);
  if (bVar1) {
    local_78.n.i64 = (Number)0x0;
    local_78.s.str = (Ch *)0x3000000000000;
    uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Fossilize *)&local_b8.s,hash,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_128.s,alloc);
    pvStack_60 = (void *)0x4050000001507a5;
    local_68 = 7;
    local_b8.s.str = (Ch *)0x1f6000000000000;
    local_b8.n = (Number)0x6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_118.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,alloc);
    local_b8.s.str = (Ch *)0x405000000150837;
    local_b8.n = (Number)0xd;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_118.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,alloc);
    local_48 = 0;
    local_58 = (void *)0x0;
    lStack_50 = 0;
    local_68 = 0;
    pvStack_60 = (void *)0x0;
    local_40 = 0x100;
    local_b8.s.str = (Ch *)0x0;
    local_a8 = (void *)0x0;
    local_a0 = (void *)0x0;
    uStack_98 = 0;
    local_90 = 0;
    local_88 = 0x200;
    local_80 = 0x144;
    local_7c = 0;
    local_b8.n = (Number)&local_68;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&local_118.s,
               (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)&local_b8.s);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (blob,lStack_50 - (long)local_58);
    __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            GetString((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &local_68);
    memcpy(__dest,__src,lStack_50 - (long)local_58);
    free(local_a0);
    operator_delete(local_a8,1);
    free(local_58);
    operator_delete(pvStack_60,1);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_118.s);
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::serialize_render_pass2(Hash hash, const VkRenderPassCreateInfo2 &create_info, vector<uint8_t> &blob) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value value;
	if (!json_value(create_info, alloc, &value))
		return false;

	Value serialized_render_passes(kObjectType);
	serialized_render_passes.AddMember(uint64_string(hash, alloc), value, alloc);

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("renderPasses2", serialized_render_passes, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize());
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	return true;
}